

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

void __thiscall hta::Metric::insert(Metric *this,Row row)

{
  Value VVar1;
  Value VVar2;
  Value VVar3;
  uint64_t uVar4;
  Value VVar5;
  rep rVar6;
  TimeAggregate ta;
  TimeAggregate ta_00;
  Row row_00;
  Duration interval;
  Level *this_00;
  duration dVar7;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar8;
  
  interval = operator*(row.interval.__r,(IntervalFactor)(this->interval_factor_).factor_);
  if ((this->interval_max_).__r < interval.__r) {
    (*((this->storage_metric_)._M_t.
       super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
       super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
       super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[3])();
    return;
  }
  this_00 = get_level(this,interval);
  (*((this->storage_metric_)._M_t.
     super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
     super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
     super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[3])();
  tVar8.__d.__r =
       (duration)
       (this_00->time_current).
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  dVar7.__r = (rep)row.time.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r;
  if (tVar8.__d.__r == (duration)0x0) {
    (this_00->time_current).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = dVar7.__r;
    tVar8.__d.__r = (duration)(duration)dVar7.__r;
  }
  else if (tVar8.__d.__r != (duration)dVar7.__r) {
    throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("inconsistent level time for interval ",
               (duration<long,_std::ratio<1L,_1000000000L>_>)interval.__r," time_current: ",
               (time_point)tVar8.__d.__r," row.time: ",(time_point)dVar7.__r);
  }
  dVar7.__r = (rep)interval_end(tVar8.__d.__r,interval);
  tVar8.__d.__r = (duration)(row.interval.__r.__r + (long)tVar8.__d.__r);
  if ((long)tVar8.__d.__r < dVar7.__r) {
    ta.aggregate.minimum._0_4_ = row.aggregate.minimum._0_4_;
    ta.time.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               tVar8.__d.__r;
    ta.aggregate.minimum._4_4_ = row.aggregate.minimum._4_4_;
    ta.aggregate.maximum._0_4_ = row.aggregate.maximum._0_4_;
    ta.aggregate.maximum._4_4_ = row.aggregate.maximum._4_4_;
    ta.aggregate.sum._0_4_ = row.aggregate.sum._0_4_;
    ta.aggregate.sum._4_4_ = row.aggregate.sum._4_4_;
    ta.aggregate.count._0_4_ = (undefined4)row.aggregate.count;
    ta.aggregate.count._4_4_ = row.aggregate.count._4_4_;
    ta.aggregate.integral._0_4_ = row.aggregate.integral._0_4_;
    ta.aggregate.integral._4_4_ = row.aggregate.integral._4_4_;
    ta.aggregate.active_time.__r._0_4_ = (undefined4)row.aggregate.active_time.__r;
    ta.aggregate.active_time.__r._4_4_ = row.aggregate.active_time.__r._4_4_;
    Level::advance(this_00,ta);
  }
  else {
    if (tVar8.__d.__r != (duration)dVar7.__r) {
      __assert_fail("row.end_time() == level_time_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                    ,0x24c,"void hta::Metric::insert(Row)");
    }
    ta_00.aggregate.minimum._0_4_ = row.aggregate.minimum._0_4_;
    ta_00.time.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           dVar7.__r;
    ta_00.aggregate.minimum._4_4_ = row.aggregate.minimum._4_4_;
    ta_00.aggregate.maximum._0_4_ = row.aggregate.maximum._0_4_;
    ta_00.aggregate.maximum._4_4_ = row.aggregate.maximum._4_4_;
    ta_00.aggregate.sum._0_4_ = row.aggregate.sum._0_4_;
    ta_00.aggregate.sum._4_4_ = row.aggregate.sum._4_4_;
    ta_00.aggregate.count._0_4_ = (undefined4)row.aggregate.count;
    ta_00.aggregate.count._4_4_ = row.aggregate.count._4_4_;
    ta_00.aggregate.integral._0_4_ = row.aggregate.integral._0_4_;
    ta_00.aggregate.integral._4_4_ = row.aggregate.integral._4_4_;
    ta_00.aggregate.active_time.__r._0_4_ = (undefined4)row.aggregate.active_time.__r;
    ta_00.aggregate.active_time.__r._4_4_ = row.aggregate.active_time.__r._4_4_;
    Level::advance(this_00,ta_00);
    VVar1 = (this_00->aggregate).minimum;
    VVar2 = (this_00->aggregate).maximum;
    VVar3 = (this_00->aggregate).sum;
    uVar4 = (this_00->aggregate).count;
    VVar5 = (this_00->aggregate).integral;
    rVar6 = (this_00->aggregate).active_time.__r;
    row_00.time.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._0_4_ = (int)(dVar7.__r - interval.__r);
    row_00.interval.__r = interval.__r;
    row_00.time.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._4_4_ = (int)((ulong)(dVar7.__r - interval.__r) >> 0x20);
    row_00.aggregate.minimum._0_4_ = SUB84(VVar1,0);
    row_00.aggregate.minimum._4_4_ = (int)((ulong)VVar1 >> 0x20);
    row_00.aggregate.maximum._0_4_ = SUB84(VVar2,0);
    row_00.aggregate.maximum._4_4_ = (int)((ulong)VVar2 >> 0x20);
    row_00.aggregate.sum._0_4_ = SUB84(VVar3,0);
    row_00.aggregate.sum._4_4_ = (int)((ulong)VVar3 >> 0x20);
    row_00.aggregate.count._0_4_ = (int)uVar4;
    row_00.aggregate.count._4_4_ = (int)(uVar4 >> 0x20);
    row_00.aggregate.integral._0_4_ = SUB84(VVar5,0);
    row_00.aggregate.integral._4_4_ = (int)((ulong)VVar5 >> 0x20);
    row_00.aggregate.active_time.__r._0_4_ = (int)rVar6;
    row_00.aggregate.active_time.__r._4_4_ = (int)((ulong)rVar6 >> 0x20);
    insert(this,row_00);
    (this_00->time_current).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = dVar7.__r;
    (this_00->aggregate).minimum = INFINITY;
    (this_00->aggregate).maximum = -INFINITY;
    (this_00->aggregate).sum = 0.0;
    (this_00->aggregate).count = 0;
    (this_00->aggregate).integral = 0.0;
    (this_00->aggregate).active_time.__r = 0;
  }
  return;
}

Assistant:

void Metric::insert(Row row)
{
    const auto interval = row.interval * interval_factor_;
    if (interval > interval_max_)
    {
        // write this but don't do anything else!
        storage_metric_->insert(row);
        return;
    }
    auto& level = get_level(interval);
    // We must do this after get_level, otherwise it confuses the level restore
    storage_metric_->insert(row);
    if (!level.time_current)
    {
        level.time_current = row.time;
    }
    else if (level.time_current != row.time)
    {
        throw_exception("inconsistent level time for interval ", interval,
                        " time_current: ", level.time_current, " row.time: ", row.time);
    }
    auto level_time_end = interval_end(level.time_current, interval);
    if (row.end_time() >= level_time_end)
    {
        // the new row from below completes the interval at current level
        // Small intervals should never cross through multiple larger ones
        assert(row.end_time() == level_time_end);
        // Close the interval and make a new one
        level.advance({ level_time_end, row.aggregate });

        auto level_time_begin = level_time_end - interval;

        // Inform higher levels of this new closed level
        insert({ interval, level_time_begin, level.aggregate });

        // reset the interval at current level
        level = Level(level_time_end);
        return;
    }

    level.advance({ row.end_time(), row.aggregate });
}